

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  ctrl_t *pcVar3;
  proxy *ppVar4;
  slot_type *psVar5;
  undefined1 auVar6 [16];
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  undefined8 uVar22;
  statement_block *psVar23;
  int iVar24;
  ctrl_t *pcVar25;
  undefined4 extraout_var;
  size_t sVar27;
  ulong uVar28;
  ulong uVar29;
  byte bVar30;
  size_t i;
  FindInfo FVar31;
  any aStack_40;
  undefined8 uStack_38;
  ulong uVar26;
  
  uVar26 = this->capacity_;
  if (uVar26 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar26 + 1 & uVar26) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x288,"size_t phmap::priv::CapacityToGrowth(size_t)");
  }
  if (uVar26 - (uVar26 >> 3) >> 1 < this->size_) {
    resize(this,uVar26 * 2 + 1);
    return;
  }
  uVar26 = this->capacity_;
  if ((uVar26 == 0) || ((uVar26 + 1 & uVar26) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>]"
                 );
  }
  if (uVar26 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f9,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>]"
                 );
  }
  pcVar3 = this->ctrl_;
  if (pcVar3[uVar26] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar25 = pcVar3 + uVar26;
  if (pcVar25 + 1 != pcVar3) {
    uVar29 = 0;
    do {
      pcVar1 = pcVar3 + uVar29;
      cVar7 = pcVar1[1];
      cVar8 = pcVar1[2];
      cVar9 = pcVar1[3];
      cVar10 = pcVar1[4];
      cVar11 = pcVar1[5];
      cVar12 = pcVar1[6];
      cVar13 = pcVar1[7];
      cVar14 = pcVar1[8];
      cVar15 = pcVar1[9];
      cVar16 = pcVar1[10];
      cVar17 = pcVar1[0xb];
      cVar18 = pcVar1[0xc];
      cVar19 = pcVar1[0xd];
      cVar20 = pcVar1[0xe];
      cVar21 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar3 + uVar29);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar7 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      uVar29 = uVar29 + 0x10;
    } while (uVar26 + 1 != uVar29);
  }
  uVar22 = *(undefined8 *)(pcVar3 + 8);
  *(undefined8 *)(pcVar25 + 1) = *(undefined8 *)pcVar3;
  *(undefined8 *)(pcVar25 + 9) = uVar22;
  *pcVar25 = -1;
  sVar27 = this->capacity_;
  if (sVar27 != 0) {
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        ppVar4 = this->slots_[i].value.first.mDat;
        if (ppVar4 == (proxy *)0x0) {
          uVar26 = 0;
        }
        else {
          iVar24 = (*ppVar4->data->_vptr_baseHolder[7])();
          uVar26 = CONCAT44(extraout_var,iVar24);
        }
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar26;
        uVar29 = SUB168(auVar6 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar6 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar31 = find_first_non_full(this,uVar29);
        sVar27 = FVar31.offset;
        uVar26 = this->capacity_;
        if ((uVar26 + 1 & uVar26) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar28 = uVar29 >> 7 & uVar26;
        bVar30 = (byte)uVar29;
        if (((i - uVar28 ^ sVar27 - uVar28) & uVar26) < 0x10) {
          bVar30 = bVar30 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar27] == -2) {
            set_ctrl(this,sVar27,bVar30 & 0x7f);
            psVar5 = this->slots_;
            aStack_40.mDat = psVar5[i].value.first.mDat;
            psVar5[i].value.first.mDat = (proxy *)0x0;
            uStack_38 = *(undefined8 *)((long)psVar5 + i * 0x10 + 8);
            cs_impl::any::recycle(&psVar5[i].key);
            psVar5 = this->slots_;
            psVar5[i].value.first.mDat = (proxy *)0x0;
            psVar23 = psVar5[sVar27].value.second;
            psVar5[i].value.first.mDat = psVar5[sVar27].value.first.mDat;
            psVar5[i].value.second = psVar23;
            psVar5[sVar27].value.first.mDat = (proxy *)0x0;
            cs_impl::any::recycle(&psVar5[sVar27].key);
            psVar5 = this->slots_;
            psVar5[sVar27].value.first.mDat = (proxy *)0x0;
            psVar5[sVar27].value.first.mDat = aStack_40.mDat;
            aStack_40.mDat = (proxy *)0x0;
            *(undefined8 *)((long)psVar5 + sVar27 * 0x10 + 8) = uStack_38;
            cs_impl::any::recycle(&aStack_40);
            i = i - 1;
            goto LAB_0017a6ad;
          }
          if (this->ctrl_[sVar27] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                          ,0x92b,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>]"
                         );
          }
          set_ctrl(this,sVar27,bVar30 & 0x7f);
          psVar5 = this->slots_;
          psVar5[sVar27].value.first.mDat = (proxy *)0x0;
          psVar23 = psVar5[i].value.second;
          psVar5[sVar27].value.first.mDat = psVar5[i].value.first.mDat;
          psVar5[sVar27].value.second = psVar23;
          psVar5[i].value.first.mDat = (proxy *)0x0;
          cs_impl::any::recycle(&psVar5[i].key);
          bVar30 = 0x80;
        }
        set_ctrl(this,i,bVar30);
      }
LAB_0017a6ad:
      i = i + 1;
      sVar27 = this->capacity_;
    } while (i != sVar27);
  }
  reset_growth_left(this,sVar27);
  return;
}

Assistant:

void rehash_and_grow_if_necessary()
			{
				if (capacity_ == 0) {
					resize(1);
				}
				else if (size() <= CapacityToGrowth(capacity()) / 2) {
					// Squash DELETED without growing if there is enough capacity.
					drop_deletes_without_resize();
				}
				else {
					// Otherwise grow the container.
					resize(capacity_ * 2 + 1);
				}
			}